

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O2

void __thiscall XMISong::XMISong(XMISong *this,FileReader *reader,EMidiDevice type,char *args)

{
  int iVar1;
  BYTE *pBVar2;
  undefined4 extraout_var;
  TrackInfo *songs;
  ulong uVar3;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__XMISong_006ea8f8;
  this->MusHeader = (BYTE *)0x0;
  this->Songs = (TrackInfo *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array = (AutoNoteOff *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Most = 0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = 0;
  iVar1 = (int)reader->Length;
  this->SongLen = iVar1;
  pBVar2 = (BYTE *)operator_new__((long)iVar1);
  this->MusHeader = pBVar2;
  iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar2,(long)iVar1);
  if (CONCAT44(extraout_var,iVar1) == (long)this->SongLen) {
    iVar1 = FindXMIDforms(this,this->MusHeader,this->SongLen,(TrackInfo *)0x0);
    this->NumSongs = iVar1;
    if (iVar1 != 0) {
      (this->super_MIDIStreamer).Division = 0x3c;
      (this->super_MIDIStreamer).InitialTempo = 500000;
      uVar3 = 0xffffffffffffffff;
      if (-1 < iVar1) {
        uVar3 = (long)iVar1 << 7;
      }
      songs = (TrackInfo *)operator_new__(uVar3);
      this->Songs = songs;
      memset(songs,0,(long)iVar1 << 7);
      FindXMIDforms(this,this->MusHeader,this->SongLen,songs);
      this->CurrSong = this->Songs;
      DPrintf(4,"XMI song count: %d\n",(ulong)(uint)this->NumSongs);
    }
  }
  return;
}

Assistant:

XMISong::XMISong (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), Songs(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif
	SongLen = reader.GetLength();
	MusHeader = new BYTE[SongLen];
	if (reader.Read(MusHeader, SongLen) != SongLen)
		return;

	// Find all the songs in this file.
	NumSongs = FindXMIDforms(MusHeader, SongLen, NULL);
	if (NumSongs == 0)
	{
		return;
	}

	// XMIDI files are played with a constant 120 Hz clock rate. While the
	// song may contain tempo events, these are vestigial remnants from the
	// original MIDI file that were not removed by the converter and should
	// be ignored.
	//
	// We can use any combination of Division and Tempo values that work out
	// to be 120 Hz.
	Division = 60;
	InitialTempo = 500000;

	Songs = new TrackInfo[NumSongs];
	memset(Songs, 0, sizeof(*Songs) * NumSongs);
	FindXMIDforms(MusHeader, SongLen, Songs);
	CurrSong = Songs;
	DPrintf(DMSG_SPAMMY, "XMI song count: %d\n", NumSongs);
}